

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O3

array<unsigned_short,_256UL> *
adjust_freqs(array<unsigned_short,_256UL> *__return_storage_ptr__,array<unsigned_long,_256UL> *freqs
            )

{
  ushort uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  long lVar6;
  size_t sym;
  ulong uVar7;
  long lVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined8 in_XMM3_Qa;
  undefined1 auVar24 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 in_XMM8_Qa;
  undefined8 in_XMM8_Qb;
  
  auVar20 = ZEXT1664((undefined1  [16])0x0);
  auVar23 = ZEXT1664((undefined1  [16])0x0);
  lVar6 = 0;
  auVar16 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])(__return_storage_ptr__->_M_elems + 0xe0) = auVar16;
  auVar16 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])(__return_storage_ptr__->_M_elems + 0xc0) = auVar16;
  auVar16 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])(__return_storage_ptr__->_M_elems + 0xa0) = auVar16;
  auVar16 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])(__return_storage_ptr__->_M_elems + 0x80) = auVar16;
  auVar16 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])(__return_storage_ptr__->_M_elems + 0x60) = auVar16;
  auVar16 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])(__return_storage_ptr__->_M_elems + 0x40) = auVar16;
  auVar16 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])(__return_storage_ptr__->_M_elems + 0x20) = auVar16;
  auVar16 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])__return_storage_ptr__->_M_elems = auVar16;
  do {
    auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])(freqs->_M_elems + lVar6));
    lVar6 = lVar6 + 8;
    uVar2 = vptestmq_avx512f(auVar16,auVar16);
    auVar23 = vpaddq_avx512f(auVar16,auVar23);
    auVar16 = vpmovm2q_avx512dq(uVar2);
    auVar20 = vpsubq_avx512f(auVar20,auVar16);
  } while (lVar6 != 0x100);
  auVar15 = vextracti64x4_avx512f(auVar20,1);
  auVar16 = vpaddq_avx512f(auVar20,ZEXT3264(auVar15));
  auVar13 = vpaddq_avx(auVar16._0_16_,auVar16._16_16_);
  auVar24 = vpshufd_avx(auVar13,0xee);
  auVar13 = vpaddq_avx(auVar13,auVar24);
  auVar15 = vextracti64x4_avx512f(auVar23,1);
  auVar16 = vpaddq_avx512f(auVar23,ZEXT3264(auVar15));
  uVar10 = auVar13._0_8_ << 6;
  auVar13 = vpaddq_avx(auVar16._0_16_,auVar16._16_16_);
  uVar7 = 0x1000;
  if (uVar10 < 0x1000) {
    uVar7 = uVar10;
  }
  auVar24 = vpshufd_avx(auVar13,0xee);
  auVar13 = vpaddq_avx(auVar13,auVar24);
  if ((POPCOUNT((int)uVar7) != 1) &&
     (uVar7 = 1L << ((ulong)(byte)-(char)LZCOUNT(uVar7) & 0x3f), uVar10 == 0)) {
    uVar7 = 1;
  }
  auVar24._8_2_ = 1;
  auVar24._0_8_ = 0x1000100010001;
  auVar24._10_2_ = 1;
  auVar24._12_2_ = 1;
  auVar24._14_2_ = 1;
  auVar13 = vcvtusi2sd_avx512f(in_ZMM4._0_16_,auVar13._0_8_);
  auVar13._0_8_ = (double)(long)uVar7 / auVar13._0_8_;
  auVar13._8_8_ = in_XMM3_Qa;
  dVar21 = 1.0;
  auVar16 = vbroadcastsd_avx512f(auVar13);
  do {
    dVar21 = dVar21 + -0.01;
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    lVar6 = 0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar21;
    auVar23 = vbroadcastsd_avx512f(auVar22);
    do {
      auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(freqs->_M_elems + lVar6));
      auVar18 = vcvtuqq2pd_avx512dq(auVar17);
      uVar3 = vptestnmq_avx512f(auVar17,auVar17);
      auVar18 = vmulpd_avx512f(auVar23,auVar18);
      auVar18 = vmulpd_avx512f(auVar16,auVar18);
      auVar15 = vcvttpd2dq_avx512f(auVar18);
      auVar13 = vpmovdw_avx512vl(auVar15);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = auVar13._0_8_;
      uVar2 = vptestmw_avx512vl(auVar25,auVar25);
      bVar4 = (byte)uVar3 | (byte)uVar2;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = auVar13._0_8_;
      auVar13 = vpblendmw_avx512vl(auVar24,auVar26);
      auVar14._0_2_ =
           (ushort)(bVar4 & 1) * auVar13._0_2_ | (ushort)!(bool)(bVar4 & 1) * auVar17._0_2_;
      bVar12 = (bool)(bVar4 >> 1 & 1);
      auVar14._2_2_ = (ushort)bVar12 * auVar13._2_2_ | (ushort)!bVar12 * auVar17._2_2_;
      bVar12 = (bool)(bVar4 >> 2 & 1);
      auVar14._4_2_ = (ushort)bVar12 * auVar13._4_2_ | (ushort)!bVar12 * auVar17._4_2_;
      bVar12 = (bool)(bVar4 >> 3 & 1);
      auVar14._6_2_ = (ushort)bVar12 * auVar13._6_2_ | (ushort)!bVar12 * auVar17._6_2_;
      bVar12 = (bool)(bVar4 >> 4 & 1);
      auVar14._8_2_ = (ushort)bVar12 * auVar13._8_2_ | (ushort)!bVar12 * auVar17._8_2_;
      bVar12 = (bool)(bVar4 >> 5 & 1);
      auVar14._10_2_ = (ushort)bVar12 * auVar13._10_2_ | (ushort)!bVar12 * auVar17._10_2_;
      bVar12 = (bool)(bVar4 >> 6 & 1);
      auVar14._12_2_ = (ushort)bVar12 * auVar13._12_2_ | (ushort)!bVar12 * auVar17._12_2_;
      auVar14._14_2_ =
           (ushort)(bVar4 >> 7) * auVar13._14_2_ | (ushort)!(bool)(bVar4 >> 7) * auVar17._14_2_;
      *(undefined1 (*) [16])(__return_storage_ptr__->_M_elems + lVar6) = auVar14;
      auVar17 = vpmovzxwq_avx512f(auVar14);
      lVar6 = lVar6 + 8;
      auVar20 = vpaddq_avx512f(auVar20,auVar17);
    } while (lVar6 != 0x100);
    auVar15 = vextracti64x4_avx512f(auVar20,1);
    auVar23 = vpaddq_avx512f(auVar20,ZEXT3264(auVar15));
    auVar13 = vpaddq_avx(auVar23._0_16_,auVar23._16_16_);
    auVar22 = vpshufd_avx(auVar13,0xee);
    auVar13 = vpaddq_avx(auVar13,auVar22);
    uVar11 = auVar13._0_8_;
    uVar10 = uVar7 - uVar11;
  } while (uVar7 < uVar11);
  lVar6 = 0xff;
  do {
    uVar9 = __return_storage_ptr__->_M_elems[lVar6];
    if ((ulong)uVar9 != 0) {
      auVar5._8_8_ = in_XMM8_Qb;
      auVar5._0_8_ = in_XMM8_Qa;
      auVar13 = vcvtusi2sd_avx512f(auVar5,uVar11);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = ((double)(long)uVar10 / auVar13._0_8_) * (double)uVar9;
      uVar7 = vcvttsd2usi_avx512f(auVar19);
      if (uVar10 < uVar7) {
        uVar7 = uVar10;
      }
      uVar11 = uVar11 - uVar9;
      uVar10 = uVar10 - uVar7;
      __return_storage_ptr__->_M_elems[lVar6] = (short)uVar7 + uVar9;
    }
    bVar12 = lVar6 != 0;
    lVar6 = lVar6 + -1;
  } while (bVar12);
  if (uVar10 != 0) {
    lVar8 = 0;
    lVar6 = 0;
    uVar9 = 0;
    do {
      uVar1 = __return_storage_ptr__->_M_elems[lVar8];
      bVar12 = uVar9 < uVar1;
      if (uVar9 <= uVar1) {
        uVar9 = uVar1;
      }
      if (bVar12) {
        lVar6 = lVar8;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
    __return_storage_ptr__->_M_elems[lVar6] =
         __return_storage_ptr__->_M_elems[lVar6] + (short)uVar10;
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<uint16_t, constants::MAX_SIGMA> adjust_freqs(
    const std::array<uint64_t, constants::MAX_SIGMA>& freqs)
{
    std::array<uint16_t, constants::MAX_SIGMA> adj_freqs { 0 };
    size_t uniq_syms = 0;
    size_t initial_sum = 0;
    for (size_t i = 0; i < constants::MAX_SIGMA; i++) {
        initial_sum += freqs[i];
        uniq_syms += freqs[i] != 0;
    }
    size_t target_frame_size = uniq_syms * constants::FRAME_FACTOR;
    if (target_frame_size > constants::MAX_FRAME_SIZE) {
        target_frame_size = constants::MAX_FRAME_SIZE;
    }
    if (!is_power_of_two(target_frame_size)) {
        target_frame_size = next_power_of_two(target_frame_size);
    }

    double c = double(target_frame_size) / double(initial_sum);
    size_t cur_frame_size = std::numeric_limits<uint64_t>::max();
    double fudge = 1.0;
    while (cur_frame_size > target_frame_size) {
        fudge -= 0.01;
        cur_frame_size = 0;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            adj_freqs[sym] = (fudge * double(freqs[sym]) * c);
            if (adj_freqs[sym] == 0 && freqs[sym] != 0)
                adj_freqs[sym] = 1;
            cur_frame_size += adj_freqs[sym];
        }
    }
    int64_t excess = target_frame_size - cur_frame_size;
    for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
        auto ncnt = adj_freqs[constants::MAX_SIGMA - sym - 1];
        if (ncnt == 0)
            continue;
        double ratio = double(excess) / double(cur_frame_size);
        size_t adder = size_t(ratio * double(ncnt));
        if (adder > excess) {
            adder = excess;
        }
        excess -= adder;
        cur_frame_size -= ncnt;
        adj_freqs[constants::MAX_SIGMA - sym - 1] += adder;
    }
    if (excess != 0) {
        size_t max_freq = 0;
        size_t max_sym = 0;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            if (adj_freqs[sym] > max_freq) {
                max_freq = adj_freqs[sym];
                max_sym = sym;
            }
        }
        adj_freqs[max_sym] += excess;
    }
    return adj_freqs;
}